

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

int __thiscall CTcTokenizer::pp_get_lone_ident(CTcTokenizer *this,char *buf,size_t bufl)

{
  size_t __n;
  tc_toktyp_t tVar1;
  
  tVar1 = next_on_line(this);
  if (tVar1 == TOKT_SYM) {
    __n = (this->curtok_).text_len_;
    if (__n <= bufl) {
      memcpy(buf,(this->curtok_).text_,__n);
      buf[(this->curtok_).text_len_] = '\0';
      tVar1 = next_on_line(this);
      if (tVar1 == TOKT_EOF) {
        return 0;
      }
      log_error(0x2720);
    }
  }
  else {
    log_error_curtok(this,0x2718);
  }
  return 1;
}

Assistant:

int CTcTokenizer::pp_get_lone_ident(char *buf, size_t bufl)
{
    /* get the next token, and make sure it's a symbol */
    if (next_on_line() != TOKT_SYM)
    {
        log_error_curtok(TCERR_BAD_DEFINE_SYM);
        return 1;
    }

    /* return an error if it doesn't fit */
    if (curtok_.get_text_len() > bufl)
        return 1;

    /* copy the text */
    memcpy(buf, curtok_.get_text(), curtok_.get_text_len());
    buf[curtok_.get_text_len()] = '\0';

    /* make sure there's nothing else on the line but whitespace */
    if (next_on_line() != TOKT_EOF)
    {
        log_error(TCERR_PP_EXTRA);
        return 1;
    }

    /* success */
    return 0;
}